

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_pkh_extkey_derive_Test::TestBody(Descriptor_Parse_pkh_extkey_derive_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  char *in_R9;
  AssertionResult gtest_ar_5;
  CfdException *except_1;
  Message local_960;
  string local_958;
  undefined1 local_938 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_908;
  Message local_900;
  bool local_8f1;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_;
  string local_8d8;
  undefined1 local_8b8 [8];
  KeyData key;
  Message local_760;
  string local_758;
  undefined1 local_738 [8];
  AssertionResult gtest_ar_3;
  Message local_720;
  string local_718;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_2;
  Message local_6e0;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_1;
  Message local_6c0;
  allocator local_6b1;
  string local_6b0;
  Script local_690;
  AssertHelper local_658;
  Message local_650;
  allocator local_641;
  string local_640;
  Script local_620;
  AssertHelper local_5e8;
  Message local_5e0;
  string local_5d8;
  AssertHelper local_5b8;
  Message local_5b0 [2];
  CfdException *anon_var_0;
  byte local_561;
  char *pcStack_560;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_550 [2];
  Descriptor local_540;
  AssertionResult gtest_ar;
  CfdException *except;
  undefined1 local_248 [8];
  Script gen_script;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  undefined1 local_30 [8];
  string descriptor;
  Descriptor_Parse_pkh_extkey_derive_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "pkh([d34db33f/44\'/0\'/0\']xpub6ERApfZwUNrhLCkDtcHTcxd75RbzS1ed54G1LkBUHQVHQKqhMkhgbmJbZRkrgZw4koxb5JaHWkY4ALHY2grBGRjaDMzQLcgJvLJuZZvRcEL/1/*)"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,"",
             (allocator *)
             ((long)&gen_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gen_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script((Script *)local_248);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_30,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_540,(string *)local_30,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_540);
      cfd::core::Descriptor::~Descriptor(&local_540);
    }
  }
  else {
    testing::Message::Message(local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x1e2,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(local_550);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffaa0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffaa0);
  if (bVar1) {
    local_561 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                ((Script *)&anon_var_0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),(Script *)&anon_var_0);
      cfd::core::Script::~Script((Script *)&anon_var_0);
    }
    if ((local_561 & 1) != 0) goto LAB_00349442;
    pcStack_560 = 
    "Expected: locking_script = desc.GetLockingScript() throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_5b0);
  testing::internal::AssertHelper::AssertHelper
            (&local_5b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
             ,0x1e3,pcStack_560);
  testing::internal::AssertHelper::operator=(&local_5b8,local_5b0);
  testing::internal::AssertHelper::~AssertHelper(&local_5b8);
  testing::Message::~Message(local_5b0);
LAB_00349442:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_5d8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_208,(string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_5d8);
    }
  }
  else {
    testing::Message::Message(&local_5e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x1e4,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    testing::Message::~Message(&local_5e0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_640,"0",&local_641);
      cfd::core::Descriptor::GetLockingScript
                (&local_620,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_640);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_620);
      cfd::core::Script::~Script(&local_620);
      std::__cxx11::string::~string((string *)&local_640);
      std::allocator<char>::~allocator((allocator<char> *)&local_641);
    }
  }
  else {
    testing::Message::Message(&local_650);
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x1e5,
               "Expected: locking_script = desc.GetLockingScript(\"0\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_658,&local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    testing::Message::~Message(&local_650);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6b0,"0/44",&local_6b1);
      cfd::core::Descriptor::GetLockingScript
                (&local_690,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_6b0);
      cfd::core::Script::operator=((Script *)local_248,&local_690);
      cfd::core::Script::~Script(&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
    }
  }
  else {
    testing::Message::Message(&local_6c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x1e6,
               "Expected: gen_script = desc.GetLockingScript(\"0/44\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_6c0);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6d8,"desc_str.c_str()","descriptor.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x1e7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  cfd::core::Script::ToString_abi_cxx11_(&local_718,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6f8,"locking_script.ToString().c_str()",
             "\"OP_DUP OP_HASH160 2a05c214617c9b0434c92d0583200a85ef61818f OP_EQUALVERIFY OP_CHECKSIG\""
             ,pcVar2,
             "OP_DUP OP_HASH160 2a05c214617c9b0434c92d0583200a85ef61818f OP_EQUALVERIFY OP_CHECKSIG"
            );
  std::__cxx11::string::~string((string *)&local_718);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_720);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x1e9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_720);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  cfd::core::Script::ToString_abi_cxx11_(&local_758,(Script *)local_248);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_738,"gen_script.ToString().c_str()",
             "\"OP_DUP OP_HASH160 c463e6dedb2b780434e60fcee3f2d0a0fbcbbc90 OP_EQUALVERIFY OP_CHECKSIG\""
             ,pcVar2,
             "OP_DUP OP_HASH160 c463e6dedb2b780434e60fcee3f2d0a0fbcbbc90 OP_EQUALVERIFY OP_CHECKSIG"
            );
  std::__cxx11::string::~string((string *)&local_758);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_738);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &key.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x1eb,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &key.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_760);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &key.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8d8,"0",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::Descriptor::GetKeyData
            ((KeyData *)local_8b8,
             (Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  local_8f1 = cfd::core::KeyData::IsValid((KeyData *)local_8b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8f0,&local_8f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar1) {
    testing::Message::Message(&local_900);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_8f0,(AssertionResult *)0x69fbd8,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_908,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x1ee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_908,&local_900);
    testing::internal::AssertHelper::~AssertHelper(&local_908);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_958,(KeyData *)local_8b8,true,kApostrophe,false);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_938,"key.ToString().c_str()",
             "\"[d34db33f/44\'/0\'/0\'/1/0]03095e95d8c50ae3f3fea93fa8e983f710489f60ff681a658c06eba64622c824b1\""
             ,pcVar2,
             "[d34db33f/44\'/0\'/0\'/1/0]03095e95d8c50ae3f3fea93fa8e983f710489f60ff681a658c06eba64622c824b1"
            );
  std::__cxx11::string::~string((string *)&local_958);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_938);
  if (!bVar1) {
    testing::Message::Message(&local_960);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_938);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x1f0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_1,&local_960);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_1);
    testing::Message::~Message(&local_960);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_938);
  cfd::core::KeyData::~KeyData((KeyData *)local_8b8);
  cfd::core::Script::~Script((Script *)local_248);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_pkh_extkey_derive) {
  std::string descriptor = "pkh([d34db33f/44'/0'/0']xpub6ERApfZwUNrhLCkDtcHTcxd75RbzS1ed54G1LkBUHQVHQKqhMkhgbmJbZRkrgZw4koxb5JaHWkY4ALHY2grBGRjaDMzQLcgJvLJuZZvRcEL/1/*)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  Script gen_script;

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_THROW(locking_script = desc.GetLockingScript(), CfdException);
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript("0"));
  EXPECT_NO_THROW(gen_script = desc.GetLockingScript("0/44"));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "OP_DUP OP_HASH160 2a05c214617c9b0434c92d0583200a85ef61818f OP_EQUALVERIFY OP_CHECKSIG");
  EXPECT_STREQ(gen_script.ToString().c_str(),
    "OP_DUP OP_HASH160 c463e6dedb2b780434e60fcee3f2d0a0fbcbbc90 OP_EQUALVERIFY OP_CHECKSIG");
  try {
    auto key = desc.GetKeyData("0");
    EXPECT_TRUE(key.IsValid());
    EXPECT_STREQ(key.ToString().c_str(),
      "[d34db33f/44'/0'/0'/1/0]03095e95d8c50ae3f3fea93fa8e983f710489f60ff681a658c06eba64622c824b1");
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
}